

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.c
# Opt level: O2

void translator_loop_x86_64
               (TranslatorOps *ops,DisasContextBase *db,CPUState *cpu,TranslationBlock *tb,
               int max_insns)

{
  uc_struct_conflict7 *val;
  TCGContext_conflict6 *tcg_ctx;
  target_ulong tVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  hook *phVar6;
  TranslationBlock *pTVar7;
  TCGLabel *a1;
  uint64_t start;
  bool bVar8;
  _Bool _Var9;
  int iVar10;
  uintptr_t o;
  undefined1 *puVar11;
  TCGv_i32 pTVar12;
  TCGv_i64 pTVar13;
  TCGv_i64 pTVar14;
  TCGTemp *ts;
  ushort uVar15;
  list_item *plVar16;
  CPUBreakpoint *pCVar17;
  anon_union_16_2_88bb8dd4_for_ops_free_ops *paVar18;
  TCGTemp *ts_00;
  list_item *plVar19;
  int iVar20;
  CPUState *tb_00;
  void *local_98;
  TCGTemp *local_78;
  TCGTemp *local_70;
  CPUState *local_68;
  TCGTemp *local_60;
  undefined1 local_58 [24];
  TCGTemp *local_40;
  
  val = cpu->uc;
  tcg_ctx = val->tcg_ctx;
  db->tb = tb;
  tVar1 = tb->pc;
  db->pc_first = tVar1;
  db->pc_next = tVar1;
  db->is_jmp = DISAS_NEXT;
  db->num_insns = 0;
  db->max_insns = max_insns;
  db->singlestep_enabled = cpu->singlestep_enabled != 0;
  tb_00 = cpu;
  (*ops->init_disas_context)(db,cpu);
  local_58._0_8_ = tb->pc;
  if (val->use_exits == 0) {
    if ((CPUState *)val->exits[(long)val->nested_level + -1] == (CPUState *)local_58._0_8_)
    goto LAB_004fce03;
  }
  else {
    tb_00 = (CPUState *)local_58;
    puVar11 = (undefined1 *)g_tree_lookup(val->ctl_exits,tb_00);
    if (puVar11 == &DAT_00000001) {
LAB_004fce03:
      gen_tb_start((TCGContext *)tcg_ctx,(TranslationBlock *)tb_00);
      (*ops->tb_start)(db,cpu);
      db->num_insns = db->num_insns + 1;
      (*ops->insn_start)(db,cpu);
      (*ops->translate_insn)(db,cpu);
      iVar20 = 0;
      local_98 = (void *)0x0;
      bVar8 = false;
      goto LAB_004fcf83;
    }
  }
  plVar19 = (list_item *)(val->hook + 3);
  uVar2 = tb->pc;
  plVar16 = plVar19;
  do {
    plVar16 = plVar16->next;
    bVar8 = plVar16 != (list_item *)0x0;
    if (plVar16 == (list_item *)0x0) {
      local_98 = (void *)0x0;
      goto LAB_004fceca;
    }
    pvVar3 = plVar16->data;
    uVar4 = *(ulong *)((long)pvVar3 + 0x18);
    uVar5 = *(ulong *)((long)pvVar3 + 0x20);
    tb_00 = (CPUState *)
            CONCAT71((int7)(uVar4 >> 8),uVar5 < uVar4 || uVar2 <= uVar5 && uVar4 <= uVar2);
  } while ((uVar4 <= uVar5 && (uVar2 > uVar5 || uVar4 > uVar2)) ||
          (*(char *)((long)pvVar3 + 0x14) != '\0'));
  local_98 = ((tcg_ctx->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
  tVar1 = db->pc_first;
  pTVar12 = tcg_const_i32_x86_64((TCGContext *)tcg_ctx,-0x7070708);
  pTVar13 = tcg_const_i64_x86_64((TCGContext *)tcg_ctx,(int64_t)val);
  pTVar14 = tcg_const_i64_x86_64((TCGContext *)tcg_ctx,tVar1);
  ts = (TCGTemp *)(pTVar13 + (long)tcg_ctx);
  ts_00 = (TCGTemp *)(pTVar14 + (long)tcg_ctx);
  tb_00 = (CPUState *)(pTVar12 + (long)tcg_ctx);
  local_60 = (TCGTemp *)0x0;
  local_78 = ts;
  local_70 = ts_00;
  local_68 = tb_00;
  if (val->hooks_count[3] == 1) {
    while (plVar19 = plVar19->next, plVar19 != (list_item *)0x0) {
      phVar6 = (hook *)plVar19->data;
      if (phVar6->to_delete == false) {
        pTVar13 = tcg_const_i64_x86_64((TCGContext *)tcg_ctx,(int64_t)phVar6->user_data);
        local_60 = (TCGTemp *)(pTVar13 + (long)tcg_ctx);
        (*val->add_inline_hook)(val,phVar6,&local_78,4);
        tcg_temp_free_internal_x86_64((TCGContext *)tcg_ctx,(TCGTemp *)(pTVar13 + (long)tcg_ctx));
      }
    }
  }
  else {
    pTVar12 = tcg_const_i32_x86_64((TCGContext *)tcg_ctx,3);
    local_58._0_8_ = tb_00;
    local_58._8_8_ = (TCGTemp *)(pTVar12 + (long)tcg_ctx);
    local_58._16_8_ = ts;
    local_40 = ts_00;
    tcg_gen_callN_x86_64
              ((TCGContext *)tcg_ctx,helper_uc_tracecode,(TCGTemp *)0x0,4,(TCGTemp **)local_58);
    tcg_temp_free_internal_x86_64((TCGContext *)tcg_ctx,(TCGTemp *)(pTVar12 + (long)tcg_ctx));
  }
  tcg_temp_free_internal_x86_64((TCGContext *)tcg_ctx,ts_00);
  tcg_temp_free_internal_x86_64((TCGContext *)tcg_ctx,ts);
  tcg_temp_free_internal_x86_64((TCGContext *)tcg_ctx,(TCGTemp *)tb_00);
LAB_004fceca:
  gen_tb_start((TCGContext *)tcg_ctx,(TranslationBlock *)tb_00);
  (*ops->tb_start)(db,cpu);
  iVar10 = db->num_insns;
  iVar20 = 0;
  do {
    db->num_insns = iVar10 + 1;
    (*ops->insn_start)(db,cpu);
    if ((db->singlestep_enabled == false) &&
       (pCVar17 = (cpu->breakpoints).tqh_first, pCVar17 != (CPUBreakpoint *)0x0)) {
      for (; pCVar17 != (CPUBreakpoint *)0x0; pCVar17 = (pCVar17->entry).tqe_next) {
        if ((pCVar17->pc == db->pc_next) &&
           (_Var9 = (*ops->breakpoint_check)(db,cpu,pCVar17), _Var9)) {
          iVar20 = 1;
          break;
        }
      }
      if (DISAS_TOO_MANY < db->is_jmp) goto LAB_004fcf83;
    }
    (*ops->translate_insn)(db,cpu);
    if (db->is_jmp != DISAS_NEXT) goto LAB_004fcf83;
  } while ((tcg_ctx->nb_ops < 4000) && (iVar10 = db->num_insns, iVar10 < db->max_insns));
  db->is_jmp = DISAS_TOO_MANY;
LAB_004fcf83:
  (*ops->tb_stop)(db,cpu);
  pTVar7 = db->tb;
  if ((pTVar7->cflags & 0x20000) != 0) {
    *(long *)(tcg_ctx->gen_insn_data[0x156][2] + 0x20) = (long)db->num_insns - (long)iVar20;
  }
  a1 = tcg_ctx->exitreq_label;
  *(uint *)a1 = *(uint *)a1 | 1;
  tcg_gen_op1_x86_64((TCGContext *)tcg_ctx,INDEX_op_set_label,(TCGArg)a1);
  tcg_gen_exit_tb_x86_64((TCGContext *)tcg_ctx,pTVar7,3);
  pTVar7 = db->tb;
  uVar15 = (short)db->pc_next - (short)db->pc_first;
  pTVar7->size = uVar15;
  pTVar7->icount = (uint16_t)db->num_insns;
  start = pTVar7->pc;
  hooked_regions_check_single(val->hook[2].head,start,(ulong)uVar15);
  hooked_regions_check_single(val->hook[3].head,start,(ulong)uVar15);
  if (bVar8) {
    paVar18 = &tcg_ctx->ops;
    if (local_98 != (void *)0x0) {
      paVar18 = (anon_union_16_2_88bb8dd4_for_ops_free_ops *)((long)local_98 + 8);
    }
    paVar18->tqh_first->args[1] = (ulong)db->tb->size;
  }
  return;
}

Assistant:

void translator_loop(const TranslatorOps *ops, DisasContextBase *db,
                     CPUState *cpu, TranslationBlock *tb, int max_insns)
{
    int bp_insn = 0;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGOp *prev_op = NULL;
    bool block_hook = false;

    /* Initialize DisasContext */
    db->tb = tb;
    db->pc_first = tb->pc;
    db->pc_next = db->pc_first;
    db->is_jmp = DISAS_NEXT;
    db->num_insns = 0;
    db->max_insns = max_insns;
    db->singlestep_enabled = cpu->singlestep_enabled;

    ops->init_disas_context(db, cpu);
    tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

    /* Reset the temp count so that we can identify leaks */
    tcg_clear_temp_count();

    /* Unicorn: early check to see if the address of this block is
     * the "run until" address. */
    if (uc_addr_is_exit(uc, tb->pc)) {
        // This should catch that instruction is at the end
        // and generate appropriate halting code.
        gen_tb_start(tcg_ctx, db->tb);
        ops->tb_start(db, cpu);
        db->num_insns++;
        ops->insn_start(db, cpu);
        ops->translate_insn(db, cpu);
        goto _end_loop;
    }

    /* Unicorn: trace this block on request
     * Only hook this block if it is not broken from previous translation due to
     * full translation cache
     */
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_BLOCK, tb->pc)) {
        prev_op = tcg_last_op(tcg_ctx);
        block_hook = true;
        gen_uc_tracecode(tcg_ctx, 0xf8f8f8f8, UC_HOOK_BLOCK_IDX, uc, db->pc_first);
    }

    // tcg_dump_ops(tcg_ctx, false, "translator loop");

    /* Start translating.  */
    gen_tb_start(tcg_ctx, db->tb);
    // tcg_dump_ops(tcg_ctx, false, "tb start");

    ops->tb_start(db, cpu);
    // tcg_dump_ops(tcg_ctx, false, "tb start 2");

    tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

    while (true) {
        db->num_insns++;

        ops->insn_start(db, cpu);
        tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

        /* Pass breakpoint hits to target for further processing */
        if (!db->singlestep_enabled
            && unlikely(!QTAILQ_EMPTY(&cpu->breakpoints))) {
            CPUBreakpoint *bp;
            QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
                if (bp->pc == db->pc_next) {
                    if (ops->breakpoint_check(db, cpu, bp)) {
                        bp_insn = 1;
                        break;
                    }
                }
            }
            /* The breakpoint_check hook may use DISAS_TOO_MANY to indicate
               that only one more instruction is to be executed.  Otherwise
               it should use DISAS_NORETURN when generating an exception,
               but may use a DISAS_TARGET_* value for Something Else.  */
            if (db->is_jmp > DISAS_TOO_MANY) {
                break;
            }
        }

        /* Disassemble one instruction.  The translate_insn hook should
           update db->pc_next and db->is_jmp to indicate what should be
           done next -- either exiting this loop or locate the start of
           the next instruction.  */
        ops->translate_insn(db, cpu);
        // tcg_dump_ops(tcg_ctx, false, "insn translate");

        /* Stop translation if translate_insn so indicated.  */
        if (db->is_jmp != DISAS_NEXT) {
            break;
        }

        /* Stop translation if the output buffer is full,
           or we have executed all of the allowed instructions.  */
        if (tcg_op_buf_full(tcg_ctx) || db->num_insns >= db->max_insns) {
            db->is_jmp = DISAS_TOO_MANY;
            break;
        }
    }

_end_loop:
    /* Emit code to exit the TB, as indicated by db->is_jmp.  */
    ops->tb_stop(db, cpu);
    gen_tb_end(tcg_ctx, db->tb, db->num_insns - bp_insn);
    // tcg_dump_ops(tcg_ctx, false, "tb end");

    /* The disas_log hook may use these values rather than recompute.  */
    db->tb->size = db->pc_next - db->pc_first;
    db->tb->icount = db->num_insns;

    hooked_regions_check(uc, db->tb->pc, db->tb->size);

    if (block_hook) {
        TCGOp *tcg_op;

        // Unicorn: patch the callback to have the proper block size.
        if (prev_op) {
            // As explained further up in the function where prev_op is
            // assigned, we move forward in the tail queue, so we're modifying the
            // move instruction generated by gen_uc_tracecode() that contains
            // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
            tcg_op = QTAILQ_NEXT(prev_op, link);
        } else {
            // this basic block is the first emulated code ever,
            // so the basic block operand is the first operand
            tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
        }

        tcg_op->args[1] = db->tb->size;
    }
}